

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * print_value(cJSON *item,int depth,int fmt)

{
  cJSON *local_28;
  char *out;
  int fmt_local;
  int depth_local;
  cJSON *item_local;
  
  local_28 = (cJSON *)0x0;
  if (item == (cJSON *)0x0) {
    item_local = (cJSON *)0x0;
  }
  else {
    switch((char)item->type) {
    case '\0':
      local_28 = (cJSON *)cJSON_strdup("false");
      break;
    case '\x01':
      local_28 = (cJSON *)cJSON_strdup("true");
      break;
    case '\x02':
      local_28 = (cJSON *)cJSON_strdup("null");
      break;
    case '\x03':
      local_28 = (cJSON *)print_number(item);
      break;
    case '\x04':
    case '\a':
      local_28 = (cJSON *)print_string(item);
      break;
    case '\x05':
      local_28 = (cJSON *)print_array(item,depth,fmt);
      break;
    case '\x06':
      local_28 = (cJSON *)print_object(item,depth,fmt);
    }
    item_local = local_28;
  }
  return (char *)item_local;
}

Assistant:

static char *
print_value(cJSON *item, int depth, int fmt)
{
    char *out = 0;
    if (!item)
        return 0;
    switch ((item->type) & 255) {
        case cJSON_NULL:
            out = cJSON_strdup("null");
            break;
        case cJSON_False:
            out = cJSON_strdup("false");
            break;
        case cJSON_True:
            out = cJSON_strdup("true");
            break;
        case cJSON_Number:
            out = print_number(item);
            break;
        case cJSON_Array:
            out = print_array(item, depth, fmt);
            break;
        case cJSON_Object:
            out = print_object(item, depth, fmt);
            break;
        case cJSON_RawString:
        case cJSON_String:
            out = print_string(item);
            break;
    }
    return out;
}